

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>::
destroy(AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>
        *this)

{
  AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>
  *this_local;
  
  freePromise<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>>
            (this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }